

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

void chacha_consume(chacha_state_internal *state,uint8_t *in,uint8_t *out,size_t inlen)

{
  int iVar1;
  int iVar2;
  ulong in_RCX;
  void *in_RDX;
  void *in_RSI;
  uint8_t *dst;
  uint8_t *src;
  size_t bytes;
  int out_aligned;
  int in_aligned;
  uint8_t buffer [1024];
  size_t local_450;
  undefined1 local_428 [416];
  size_t in_stack_fffffffffffffd78;
  uint8_t *in_stack_fffffffffffffd80;
  uint8_t *in_stack_fffffffffffffd88;
  chacha_state_conflict *in_stack_fffffffffffffd90;
  ulong local_20;
  void *local_18;
  void *local_10;
  
  if (in_RCX != 0) {
    iVar1 = chacha_is_aligned(in_RSI);
    iVar2 = chacha_is_aligned(in_RDX);
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    if ((iVar1 == 0) || (iVar2 == 0)) {
      for (; local_20 != 0; local_20 = local_20 - local_450) {
        if (local_20 < 0x401) {
          local_450 = local_20;
        }
        else {
          local_450 = 0x400;
        }
        if (iVar1 == 0) {
          memcpy(local_428,local_10,local_450);
        }
        chacha_blocks_ref(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                          in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        if (iVar2 == 0) {
          memcpy(local_18,local_428,local_450);
        }
        if (local_10 != (void *)0x0) {
          local_10 = (void *)(local_450 + (long)local_10);
        }
        local_18 = (void *)(local_450 + (long)local_18);
      }
    }
    else {
      chacha_blocks_ref(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                        in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    }
  }
  return;
}

Assistant:

static void
chacha_consume(chacha_state_internal *state, const uint8_t *in, uint8_t *out, size_t inlen) {
    uint8_t buffer[16 * CHACHA_BLOCKBYTES];
    int in_aligned, out_aligned;

    /* it's ok to call with 0 bytes */
    if (!inlen)
        return;

    /* if everything is aligned, handle directly */
    in_aligned = chacha_is_aligned(in);
    out_aligned = chacha_is_aligned(out);
    if (in_aligned && out_aligned) {
        chacha_blocks_ref(state, in, out, inlen);
        return;
    }

    /* copy the unaligned data to an aligned buffer and process in chunks */
    while (inlen) {
        const size_t bytes = (inlen > sizeof(buffer)) ? sizeof(buffer) : inlen;
        const uint8_t *src = in;
        uint8_t *dst = (out_aligned) ? out : buffer;
        if (!in_aligned) {
            memcpy(buffer, in, bytes);
            src = buffer;
        }
        chacha_blocks_ref(state, src, dst, bytes);
        if (!out_aligned)
            memcpy(out, buffer, bytes);
        if (in) in += bytes;
        out += bytes;
        inlen -= bytes;
    }
}